

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::CollationElementIterator::setOffset
          (CollationElementIterator *this,int32_t newOffset,UErrorCode *status)

{
  short sVar1;
  RuleBasedCollator *this_00;
  UBool UVar2;
  int iVar3;
  UChar32 c;
  uint uVar4;
  char16_t *pcVar5;
  uint c_00;
  int32_t lastSafeOffset;
  ulong uVar6;
  ulong uVar7;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  uVar7 = (ulong)(uint)newOffset;
  if (0 < newOffset) {
    sVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->string_).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (newOffset < iVar3) {
      uVar6 = uVar7;
      do {
        sVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
        uVar4 = (int)sVar1 >> 5;
        if (sVar1 < 0) {
          uVar4 = (this->string_).fUnion.fFields.fLength;
        }
        c_00 = 0xffff;
        if (uVar6 < uVar4) {
          pcVar5 = (char16_t *)((long)&(this->string_).fUnion + 2);
          if (((int)sVar1 & 2U) == 0) {
            pcVar5 = (this->string_).fUnion.fFields.fArray;
          }
          c_00 = (uint)(ushort)pcVar5[uVar6];
        }
        UVar2 = RuleBasedCollator::isUnsafe(this->rbc_,c_00);
        if (UVar2 == '\0') goto LAB_00221ff1;
        if ((c_00 & 0xfc00) == 0xd800) {
          this_00 = this->rbc_;
          c = UnicodeString::char32At(&this->string_,(int32_t)uVar6);
          UVar2 = RuleBasedCollator::isUnsafe(this_00,c);
          if (UVar2 == '\0') goto LAB_00221ff1;
        }
        uVar6 = uVar6 - 1;
      } while ((int)uVar6 != 0);
      uVar6 = 0;
LAB_00221ff1:
      uVar4 = (uint)uVar6;
      while ((int)uVar4 < newOffset) {
        (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,uVar6 & 0xffffffff);
        do {
          CollationIterator::nextCE(this->iter_,status);
          if (U_ZERO_ERROR < *status) {
            return;
          }
          uVar4 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
        } while (uVar4 == (uint)uVar6);
        uVar6 = uVar6 & 0xffffffff;
        uVar7 = uVar6;
        if ((int)uVar4 <= newOffset) {
          uVar6 = (ulong)uVar4;
          uVar7 = uVar6;
        }
      }
    }
  }
  (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,uVar7);
  this->otherHalf_ = 0;
  this->dir_ = '\x01';
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }